

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_lightbuffer.cpp
# Opt level: O3

int __thiscall FLightBuffer::UploadLights(FLightBuffer *this,FDynLightData *data)

{
  int iVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  _func_void_GLenum_GLsizeiptr_void_ptr_GLenum **pp_Var6;
  float *pfVar7;
  uint uVar8;
  GLenum GVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  GLbitfield GVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  uint newbuffer;
  GLuint local_44;
  FDynLightData *local_40;
  ulong local_38;
  
  uVar15 = data->arrays[0].Count >> 2;
  uVar16 = data->arrays[1].Count >> 2;
  uVar11 = data->arrays[2].Count >> 2;
  uVar13 = uVar11 + uVar16 + uVar15 + 1;
  local_38 = (ulong)uVar13;
  uVar12 = this->mBlockAlign;
  if (uVar12 != 0) {
    uVar5 = this->mBlockSize;
    if ((uVar5 < this->mIndex % uVar12 + uVar13) &&
       (uVar8 = this->mIndex + uVar12, this->mIndex = uVar8 - uVar8 % uVar12,
       uVar5 <= uVar16 + uVar15 + uVar11)) {
      uVar12 = (uVar5 - uVar13) + uVar11;
      uVar11 = 0;
      if (0 < (int)uVar12) {
        uVar11 = uVar12;
      }
      if (-1 < (int)uVar12) {
        uVar12 = 0;
      }
      uVar12 = uVar12 + uVar16;
      uVar16 = 0;
      if (0 < (int)uVar12) {
        uVar16 = uVar12;
      }
      if (-1 < (int)uVar12) {
        uVar12 = 0;
      }
      uVar15 = uVar12 + uVar15;
      local_38 = (ulong)(uVar11 + uVar16 + uVar15 + 1);
    }
  }
  uVar12 = 0xffffffff;
  if (1 < (int)local_38) {
    if (this->mBufferSize >> 2 < this->mIndex + (int)local_38) {
      local_40 = data;
      (*_ptrc_glBindBuffer)(this->mBufferType,this->mBufferId);
      (*_ptrc_glUnmapBuffer)(this->mBufferType);
      (*_ptrc_glGenBuffers)(1,&local_44);
      (*_ptrc_glBindBufferBase)(this->mBufferType,1,local_44);
      (*_ptrc_glBindBuffer)(this->mBufferType,local_44);
      (*_ptrc_glBindBuffer)(0x8f36,this->mBufferId);
      uVar3 = this->mBufferSize;
      uVar4 = this->mByteSize;
      this->mBufferSize = uVar3 * 2;
      this->mByteSize = uVar4 * 2;
      bVar17 = gl.lightmethod == 2;
      GVar9 = 0x88e8;
      if (bVar17) {
        GVar9 = 0xc2;
      }
      GVar14 = 10;
      if (bVar17) {
        GVar14 = 0xc2;
      }
      pp_Var6 = &_ptrc_glBufferData;
      if (bVar17) {
        pp_Var6 = (_func_void_GLenum_GLsizeiptr_void_ptr_GLenum **)&_ptrc_glBufferStorage;
      }
      (**pp_Var6)(this->mBufferType,(GLsizeiptr)(uVar4 * 2),(void *)0x0,GVar9);
      pfVar7 = (float *)(*_ptrc_glMapBufferRange)
                                  (this->mBufferType,0,(GLsizeiptr)this->mByteSize,GVar14);
      this->mBufferPointer = pfVar7;
      (*_ptrc_glCopyBufferSubData)(0x8f36,this->mBufferType,0,0,0);
      (*_ptrc_glBindBuffer)(0x8f36,0);
      (*_ptrc_glDeleteBuffers)(1,&this->mBufferId);
      this->mBufferId = local_44;
      data = local_40;
    }
    pfVar7 = this->mBufferPointer;
    if (pfVar7 == (float *)0x0) {
      __assert_fail("mBufferPointer != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/gl/dynlights/gl_lightbuffer.cpp"
                    ,0xae,"int FLightBuffer::UploadLights(FDynLightData &)");
    }
    uVar10 = (ulong)(this->mIndex << 2);
    pfVar2 = pfVar7 + uVar10;
    iVar1 = uVar15 + uVar16;
    *pfVar2 = 0.0;
    *(ulong *)(pfVar2 + 1) = CONCAT44((float)iVar1,(float)(int)uVar15);
    pfVar2[3] = (float)(int)(uVar11 + iVar1);
    memcpy(pfVar7 + uVar10 + 4,data->arrays[0].Array,(long)(int)(uVar15 << 2) * 4);
    memcpy(pfVar2 + (long)(int)(uVar15 << 2) + 4,data->arrays[1].Array,(ulong)(uVar16 << 2) << 2);
    memcpy(pfVar2 + (long)(iVar1 * 4) + 4,data->arrays[2].Array,(ulong)(uVar11 << 2) << 2);
    uVar12 = this->mIndex;
    this->mIndex = uVar12 + (int)local_38;
    draw_dlight = draw_dlight + ((int)local_38 - 1U >> 1);
  }
  return uVar12;
}

Assistant:

int FLightBuffer::UploadLights(FDynLightData &data)
{
	int size0 = data.arrays[0].Size()/4;
	int size1 = data.arrays[1].Size()/4;
	int size2 = data.arrays[2].Size()/4;
	int totalsize = size0 + size1 + size2 + 1;

	// pointless type casting because some compilers can't print enough warnings.
	if (mBlockAlign > 0 && (unsigned int)totalsize + (mIndex % mBlockAlign) > mBlockSize)
	{
		mIndex = ((mIndex + mBlockAlign) / mBlockAlign) * mBlockAlign;

		// can't be rendered all at once.
		if ((unsigned int)totalsize > mBlockSize)
		{
			int diff = totalsize - (int)mBlockSize;

			size2 -= diff;
			if (size2 < 0)
			{
				size1 += size2;
				size2 = 0;
			}
			if (size1 < 0)
			{
				size0 += size1;
				size1 = 0;
			}
			totalsize = size0 + size1 + size2 + 1;
		}
	}

	if (totalsize <= 1) return -1;

	if (mIndex + totalsize > mBufferSize/4)
	{
		// reallocate the buffer with twice the size
		unsigned int newbuffer;

		// first unmap the old buffer
		glBindBuffer(mBufferType, mBufferId);
		glUnmapBuffer(mBufferType);

		// create and bind the new buffer, bind the old one to a copy target (too bad that DSA is not yet supported well enough to omit this crap.)
		glGenBuffers(1, &newbuffer);
		glBindBufferBase(mBufferType, LIGHTBUF_BINDINGPOINT, newbuffer);
		glBindBuffer(mBufferType, newbuffer);	// Note: Some older AMD drivers don't do that in glBindBufferBase, as they should.
		glBindBuffer(GL_COPY_READ_BUFFER, mBufferId);

		// create the new buffer's storage (twice as large as the old one)
		mBufferSize *= 2;
		mByteSize *= 2;
		if (gl.lightmethod == LM_DIRECT)
		{
			glBufferStorage(mBufferType, mByteSize, NULL, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
			mBufferPointer = (float*)glMapBufferRange(mBufferType, 0, mByteSize, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
		}
		else
		{
			glBufferData(mBufferType, mByteSize, NULL, GL_DYNAMIC_DRAW);
			mBufferPointer = (float*)glMapBufferRange(mBufferType, 0, mByteSize, GL_MAP_WRITE_BIT|GL_MAP_INVALIDATE_BUFFER_BIT);
		}

		// copy contents and delete the old buffer.
		glCopyBufferSubData(GL_COPY_READ_BUFFER, mBufferType, 0, 0, mByteSize/2);
		glBindBuffer(GL_COPY_READ_BUFFER, 0);
		glDeleteBuffers(1, &mBufferId);
		mBufferId = newbuffer;
	}

	float *copyptr;
	
	assert(mBufferPointer != NULL);
	if (mBufferPointer == NULL) return -1;
	copyptr = mBufferPointer + mIndex * 4;

	float parmcnt[] = { 0, float(size0), float(size0 + size1), float(size0 + size1 + size2) };

	memcpy(&copyptr[0], parmcnt, 4 * sizeof(float));
	memcpy(&copyptr[4], &data.arrays[0][0], 4 * size0*sizeof(float));
	memcpy(&copyptr[4 + 4*size0], &data.arrays[1][0], 4 * size1*sizeof(float));
	memcpy(&copyptr[4 + 4*(size0 + size1)], &data.arrays[2][0], 4 * size2*sizeof(float));

	unsigned int bufferindex = mIndex;
	mIndex += totalsize;
	draw_dlight += (totalsize-1) / 2;
	return bufferindex;
}